

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtb.cc
# Opt level: O0

void __thiscall dtc::dtb::asm_writer::write_data(asm_writer *this,uint32_t v)

{
  uint32_t v_local;
  asm_writer *this_local;
  
  if ((this->bytes_written & 3) != 0) {
    write_line(this,"\t.balign 4\n");
    this->bytes_written = (4 - (this->bytes_written & 3)) + this->bytes_written;
  }
  write_byte(this,(uint8_t)(v >> 0x18));
  write_byte(this,(uint8_t)(v >> 0x10));
  write_byte(this,(uint8_t)(v >> 8));
  write_byte(this,(uint8_t)v);
  this->bytes_written = this->bytes_written + 4;
  return;
}

Assistant:

void
asm_writer::write_data(uint32_t v)
{
	if (bytes_written % 4 != 0)
	{
		write_line("\t.balign 4\n");
		bytes_written += (4 - (bytes_written % 4));
	}
	write_byte((v >> 24) & 0xff);
	write_byte((v >> 16) & 0xff);
	write_byte((v >> 8) & 0xff);
	write_byte((v >> 0) & 0xff);
	bytes_written += 4;
}